

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeKernelSetGroupSize
          (ze_kernel_handle_t hKernel,uint32_t groupSizeX,uint32_t groupSizeY,uint32_t groupSizeZ)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeKernelSetGroupSize(hKernel, groupSizeX, groupSizeY, groupSizeZ)"
             ,&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0x570) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0x570);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeKernelSetGroupSizePrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hKernel,groupSizeX
                                ,groupSizeY,groupSizeZ), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hKernel,groupSizeX,groupSizeY,groupSizeZ);
          lVar4 = 0;
          goto LAB_00151d65;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar3 * 8);
      result = (**(code **)(*plVar1 + 0x740))(plVar1,hKernel,groupSizeX,groupSizeY,groupSizeZ);
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00151da2;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x748))(plVar1,hKernel,groupSizeX,groupSizeY,groupSizeZ,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00151d65:
    result = zVar2;
    if (lVar5 == lVar4) break;
  }
LAB_00151da2:
  logAndPropagateResult("zeKernelSetGroupSize",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetGroupSize(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t groupSizeX,                            ///< [in] group size for X dimension to use for this kernel
        uint32_t groupSizeY,                            ///< [in] group size for Y dimension to use for this kernel
        uint32_t groupSizeZ                             ///< [in] group size for Z dimension to use for this kernel
        )
    {
        context.logger->log_trace("zeKernelSetGroupSize(hKernel, groupSizeX, groupSizeY, groupSizeZ)");

        auto pfnSetGroupSize = context.zeDdiTable.Kernel.pfnSetGroupSize;

        if( nullptr == pfnSetGroupSize )
            return logAndPropagateResult("zeKernelSetGroupSize", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelSetGroupSizePrologue( hKernel, groupSizeX, groupSizeY, groupSizeZ );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeKernelSetGroupSizePrologue( hKernel, groupSizeX, groupSizeY, groupSizeZ );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }

        auto driver_result = pfnSetGroupSize( hKernel, groupSizeX, groupSizeY, groupSizeZ );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelSetGroupSizeEpilogue( hKernel, groupSizeX, groupSizeY, groupSizeZ ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }

        return logAndPropagateResult("zeKernelSetGroupSize", driver_result);
    }